

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O1

int __thiscall geemuboi::core::CPU::rrc_mhl(CPU *this)

{
  uint8_t *puVar1;
  ushort uVar2;
  int iVar3;
  byte bVar4;
  uint uVar5;
  
  uVar2._0_1_ = this->regs->h;
  uVar2._1_1_ = this->regs->l;
  uVar5 = (uint)(ushort)(uVar2 << 8 | uVar2 >> 8);
  iVar3 = (**this->mmu->_vptr_IMmu)(this->mmu,(ulong)uVar5);
  bVar4 = (byte)iVar3;
  this->regs->f = (bVar4 & 1) << 4;
  if (bVar4 == 0) {
    puVar1 = &this->regs->f;
    *puVar1 = *puVar1 | 0x80;
  }
  (*this->mmu->_vptr_IMmu[2])(this->mmu,(ulong)uVar5,(ulong)(byte)(bVar4 >> 1 | bVar4 << 7));
  return 4;
}

Assistant:

int CPU::rrc_mhl() {
    uint16_t addr = (regs.h << 8) + regs.l;
    uint8_t val = mmu.read_byte(addr);
    rrc_r8(val);
    mmu.write_byte(addr, val);
    return 4;
}